

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O1

int stb_vorbis_decode_frame_pushdata
              (stb_vorbis *f,uint8 *data,int data_len,int *channels,float ***output,int *samples)

{
  CRCscan *pCVar1;
  CRCscan *pCVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  uint8 *puVar11;
  uint uVar12;
  uint8 *puVar13;
  uint32 uVar14;
  ulong uVar15;
  uint uVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int len;
  int left;
  int right;
  int local_50;
  int local_4c [5];
  int local_38;
  int local_34;
  
  if (f->push_mode == '\0') {
    f->error = VORBIS_invalid_api_mixing;
  }
  else {
    if (-1 < f->page_crc_tests) {
      *samples = 0;
      auVar4 = _DAT_0019d2d0;
      iVar5 = f->page_crc_tests;
      if (0 < (long)iVar5) {
        lVar10 = (long)iVar5 + -1;
        auVar18._8_4_ = (int)lVar10;
        auVar18._0_8_ = lVar10;
        auVar18._12_4_ = (int)((ulong)lVar10 >> 0x20);
        lVar10 = 0;
        auVar18 = auVar18 ^ _DAT_0019d2d0;
        auVar19 = _DAT_0019d2f0;
        auVar20 = _DAT_0019d2c0;
        do {
          auVar21 = auVar20 ^ auVar4;
          iVar8 = auVar18._4_4_;
          if ((bool)(~(auVar21._4_4_ == iVar8 && auVar18._0_4_ < auVar21._0_4_ ||
                      iVar8 < auVar21._4_4_) & 1)) {
            *(undefined4 *)((long)&f->scan[0].bytes_done + lVar10) = 0;
          }
          if ((auVar21._12_4_ != auVar18._12_4_ || auVar21._8_4_ <= auVar18._8_4_) &&
              auVar21._12_4_ <= auVar18._12_4_) {
            *(undefined4 *)((long)&f->scan[1].bytes_done + lVar10) = 0;
          }
          auVar21 = auVar19 ^ auVar4;
          iVar6 = auVar21._4_4_;
          if (iVar6 <= iVar8 && (iVar6 != iVar8 || auVar21._0_4_ <= auVar18._0_4_)) {
            *(undefined4 *)((long)&f->scan[2].bytes_done + lVar10) = 0;
            *(undefined4 *)((long)&f->scan[3].bytes_done + lVar10) = 0;
          }
          lVar7 = auVar20._8_8_;
          auVar20._0_8_ = auVar20._0_8_ + 4;
          auVar20._8_8_ = lVar7 + 4;
          lVar7 = auVar19._8_8_;
          auVar19._0_8_ = auVar19._0_8_ + 4;
          auVar19._8_8_ = lVar7 + 4;
          lVar10 = lVar10 + 0x50;
        } while ((ulong)(iVar5 + 3U >> 2) * 0x50 != lVar10);
      }
      local_50 = data_len;
      if (iVar5 < 4) {
        if (data_len < 4) {
          return 0;
        }
        local_50 = data_len + -3;
        puVar11 = data + 0x1b;
        lVar10 = 0;
        puVar13 = data;
        do {
          if ((data[lVar10] == 'O') && (*(uint8 (*) [4])(data + lVar10) == ogg_page_header)) {
            iVar5 = (int)lVar10;
            if (iVar5 + 0x1a < local_50) {
              bVar3 = data[lVar10 + 0x1a];
              if ((int)(iVar5 + 0x1b + (uint)bVar3) < local_50) {
                iVar8 = bVar3 + 0x1b;
                if (bVar3 != 0) {
                  uVar15 = 0;
                  do {
                    iVar8 = iVar8 + (uint)puVar11[uVar15];
                    uVar15 = uVar15 + 1;
                  } while (bVar3 != uVar15);
                }
                uVar16 = 0;
                lVar7 = -0x16;
                do {
                  uVar16 = uVar16 << 8 ^ crc_table[uVar16 >> 0x18 ^ (uint)puVar13[lVar7 + 0x16]];
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 0);
                iVar6 = 4;
                do {
                  uVar16 = uVar16 << 8 ^ crc_table[uVar16 >> 0x18];
                  iVar6 = iVar6 + -1;
                } while (iVar6 != 0);
                iVar6 = f->page_crc_tests;
                f->page_crc_tests = iVar6 + 1;
                f->scan[iVar6].bytes_left = iVar8 + -0x1a;
                f->scan[iVar6].crc_so_far = uVar16;
                f->scan[iVar6].goal_crc = *(uint32 *)(data + lVar10 + 0x16);
                if (data[(ulong)data[lVar10 + 0x1a] + lVar10 + 0x1a] == 0xff) {
                  uVar14 = 0xffffffff;
                }
                else {
                  uVar14 = *(uint32 *)(data + lVar10 + 6);
                }
                f->scan[iVar6].sample_loc = uVar14;
                f->scan[iVar6].bytes_done = iVar5 + 0x1a;
                bVar17 = iVar6 + 1 != 4;
                iVar5 = local_50;
              }
              else {
                bVar17 = false;
              }
            }
            else {
              bVar17 = false;
            }
            local_50 = iVar5;
            if (!bVar17) break;
          }
          lVar10 = lVar10 + 1;
          puVar11 = puVar11 + 1;
          puVar13 = puVar13 + 1;
        } while (lVar10 < local_50);
      }
      iVar5 = 0;
      do {
        iVar8 = f->page_crc_tests;
        if (iVar8 <= iVar5) {
          return local_50;
        }
        iVar6 = f->scan[iVar5].bytes_done;
        uVar16 = f->scan[iVar5].bytes_left;
        uVar14 = f->scan[iVar5].crc_so_far;
        uVar9 = local_50 - iVar6;
        uVar12 = uVar9;
        if ((int)uVar16 < (int)uVar9) {
          uVar12 = uVar16;
        }
        if (0 < (int)uVar12) {
          uVar15 = 0;
          do {
            uVar14 = uVar14 << 8 ^ crc_table[uVar14 >> 0x18 ^ (uint)data[uVar15 + (long)iVar6]];
            uVar15 = uVar15 + 1;
          } while (uVar12 != uVar15);
        }
        pCVar1 = f->scan + iVar5;
        pCVar1->bytes_left = uVar16 - uVar12;
        pCVar1->crc_so_far = uVar14;
        if ((int)uVar9 < (int)uVar16) {
          iVar5 = iVar5 + 1;
          bVar17 = true;
        }
        else if (uVar14 == pCVar1->goal_crc) {
          local_50 = uVar12 + iVar6;
          f->page_crc_tests = -1;
          f->previous_length = 0;
          f->next_seg = -1;
          uVar14 = pCVar1->sample_loc;
          f->current_loc = uVar14;
          f->current_loc_valid = (uint)(uVar14 != 0xffffffff);
          bVar17 = false;
        }
        else {
          f->page_crc_tests = iVar8 + -1;
          pCVar1->sample_loc = f->scan[(long)iVar8 + -1].sample_loc;
          pCVar2 = f->scan + (long)iVar8 + -1;
          iVar8 = pCVar2->bytes_left;
          uVar14 = pCVar2->crc_so_far;
          iVar6 = pCVar2->bytes_done;
          pCVar1->goal_crc = pCVar2->goal_crc;
          pCVar1->bytes_left = iVar8;
          pCVar1->crc_so_far = uVar14;
          pCVar1->bytes_done = iVar6;
          bVar17 = true;
        }
      } while (bVar17);
      return local_50;
    }
    f->stream = data;
    f->stream_end = data + data_len;
    f->error = VORBIS__no_error;
    iVar5 = is_whole_packet_present(f);
    if (iVar5 != 0) {
      iVar5 = vorbis_decode_packet(f,local_4c,&local_38,&local_34);
      if (iVar5 == 0) {
        if (f->error == VORBIS_continued_packet_flag_invalid) {
          if (f->previous_length != 0) goto LAB_0016fd86;
          f->error = VORBIS__no_error;
          do {
            iVar5 = get8_packet_raw(f);
            f->valid_bits = 0;
            if (iVar5 == -1) break;
          } while (f->eof == 0);
        }
        else {
          if (f->error != VORBIS_bad_packet_type) {
LAB_0016fd86:
            f->previous_length = 0;
            f->page_crc_tests = 0;
            f->discard_samples_deferred = 0;
            f->samples_output = 0;
            f->current_loc_valid = 0;
            f->first_decode = '\0';
            f->channel_buffer_start = 0;
            f->channel_buffer_end = 0;
            *samples = 0;
            return 1;
          }
          f->error = VORBIS__no_error;
          do {
            iVar5 = get8_packet_raw(f);
            f->valid_bits = 0;
            if (iVar5 == -1) break;
          } while (f->eof == 0);
        }
        *samples = 0;
      }
      else {
        iVar8 = vorbis_finish_frame(f,local_4c[0],local_38,local_34);
        iVar5 = f->channels;
        if (0 < (long)iVar5) {
          lVar10 = 0;
          do {
            f->outputs[lVar10] = f->channel_buffers[lVar10] + local_38;
            lVar10 = lVar10 + 1;
          } while (iVar5 != lVar10);
        }
        if (channels != (int *)0x0) {
          *channels = iVar5;
        }
        *samples = iVar8;
        *output = f->outputs;
      }
      return *(int *)&f->stream - (int)data;
    }
    *samples = 0;
  }
  return 0;
}

Assistant:

int stb_vorbis_decode_frame_pushdata(
         stb_vorbis *f,                   // the file we're decoding
         const uint8 *data, int data_len, // the memory available for decoding
         int *channels,                   // place to write number of float * buffers
         float ***output,                 // place to write float ** array of float * buffers
         int *samples                     // place to write number of output samples
     )
{
   int i;
   int len,right,left;

   if (!IS_PUSH_MODE(f)) return error(f, VORBIS_invalid_api_mixing);

   if (f->page_crc_tests >= 0) {
      *samples = 0;
      return vorbis_search_for_page_pushdata(f, (uint8 *) data, data_len);
   }

   f->stream     = (uint8 *) data;
   f->stream_end = (uint8 *) data + data_len;
   f->error      = VORBIS__no_error;

   // check that we have the entire packet in memory
   if (!is_whole_packet_present(f)) {
      *samples = 0;
      return 0;
   }

   if (!vorbis_decode_packet(f, &len, &left, &right)) {
      // save the actual error we encountered
      enum STBVorbisError error = f->error;
      if (error == VORBIS_bad_packet_type) {
         // flush and resynch
         f->error = VORBIS__no_error;
         while (get8_packet(f) != EOP)
            if (f->eof) break;
         *samples = 0;
         return (int) (f->stream - data);
      }
      if (error == VORBIS_continued_packet_flag_invalid) {
         if (f->previous_length == 0) {
            // we may be resynching, in which case it's ok to hit one
            // of these; just discard the packet
            f->error = VORBIS__no_error;
            while (get8_packet(f) != EOP)
               if (f->eof) break;
            *samples = 0;
            return (int) (f->stream - data);
         }
      }
      // if we get an error while parsing, what to do?
      // well, it DEFINITELY won't work to continue from where we are!
      stb_vorbis_flush_pushdata(f);
      // restore the error that actually made us bail
      f->error = error;
      *samples = 0;
      return 1;
   }

   // success!
   len = vorbis_finish_frame(f, len, left, right);
   for (i=0; i < f->channels; ++i)
      f->outputs[i] = f->channel_buffers[i] + left;

   if (channels) *channels = f->channels;
   *samples = len;
   *output = f->outputs;
   return (int) (f->stream - data);
}